

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  _Rb_tree_header *p_Var1;
  pointer pAVar2;
  pointer pAVar3;
  string local_50;
  
  this->type_ = kCfdSuccess;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  ::std::__cxx11::string::string((string *)&this->address_,(string *)address_string);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  pAVar2 = (network_parameters->
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (network_parameters->
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::string((string *)&local_50,(string *)address_string);
  if (pAVar2 == pAVar3) {
    network_parameters =
         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0;
  }
  DecodeAddress(this,&local_50,network_parameters);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Address::Address(
    const std::string& address_string,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(kMainnet),
      addr_type_(kP2shAddress),
      witness_ver_(kVersionNone),
      address_(address_string),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  const std::vector<AddressFormatData>* params = nullptr;
  if (!network_parameters.empty()) {
    params = &network_parameters;
  }
  DecodeAddress(address_string, params);
}